

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiTextEditState::ImGuiTextEditState(ImGuiTextEditState *this)

{
  ImGuiTextEditState *this_local;
  
  ImVector<unsigned_short>::ImVector(&this->Text);
  ImVector<char>::ImVector(&this->InitialText);
  ImVector<char>::ImVector(&this->TempTextBuffer);
  memset(this,0,0xce8);
  return;
}

Assistant:

ImGuiTextEditState()                            { memset(this, 0, sizeof(*this)); }